

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O0

void __thiscall FListMenuItemPlayerDisplay::UpdateRandomClass(FListMenuItemPlayerDisplay *this)

{
  int iVar1;
  uint uVar2;
  FPlayerClass *pFVar3;
  AActor *pAVar4;
  int local_20;
  FListMenuItemPlayerDisplay *this_local;
  
  iVar1 = this->mRandomTimer + -1;
  this->mRandomTimer = iVar1;
  if (iVar1 < 0) {
    iVar1 = this->mRandomClass + 1;
    this->mRandomClass = iVar1;
    uVar2 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
    if ((int)uVar2 <= iVar1) {
      this->mRandomClass = 0;
    }
    pFVar3 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(long)this->mRandomClass)
    ;
    this->mPlayerClass = pFVar3;
    pAVar4 = GetDefaultByType((PClass *)this->mPlayerClass->Type);
    this->mPlayerState = pAVar4->SeeState;
    if (this->mPlayerState == (FState *)0x0) {
      pAVar4 = GetDefaultByType((PClass *)this->mPlayerClass->Type);
      this->mPlayerState = pAVar4->SpawnState;
    }
    if (this->mPlayerState == (FState *)0x0) {
      local_20 = -1;
    }
    else {
      local_20 = FState::GetTics(this->mPlayerState);
    }
    this->mPlayerTics = local_20;
    this->mRandomTimer = 6;
    UpdateTranslation(this);
  }
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::UpdateRandomClass()
{
	if (--mRandomTimer < 0)
	{
		if (++mRandomClass >= (int)PlayerClasses.Size ()) mRandomClass = 0;
		mPlayerClass = &PlayerClasses[mRandomClass];
		mPlayerState = GetDefaultByType (mPlayerClass->Type)->SeeState;
		if (mPlayerState == NULL)
		{ // No see state, so try spawn state.
			mPlayerState = GetDefaultByType (mPlayerClass->Type)->SpawnState;
		}
		mPlayerTics = mPlayerState != NULL ? mPlayerState->GetTics() : -1;
		mRandomTimer = 6;

		// Since the newly displayed class may used a different translation
		// range than the old one, we need to update the translation, too.
		UpdateTranslation();
	}
}